

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::detail::decomp_assert(Enum at,char *file,int line,char *expr,Result *result)

{
  bool bVar1;
  code *pcVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  ResultBuilder rb;
  anon_union_24_2_13149d16_for_String_3 local_d8;
  ResultBuilder local_c0;
  
  bVar1 = result->m_passed;
  local_c0.super_AssertData.m_failed = (bool)(bVar1 ^ 1);
  if (is_running_in_test == '\0') {
    if (bVar1 != false) {
      return bVar1;
    }
    String::allocate((String *)&local_d8.data,0);
    ResultBuilder::ResultBuilder(&local_c0,at,file,line,expr,"",(String *)&local_d8.data);
    if ((local_d8.buf[0x17] < '\0') && (local_d8.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.data.ptr);
    }
    String::operator=(&local_c0.super_AssertData.m_decomp,&result->m_decomp);
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    (**(code **)(g_cs + 0x10e8))(&local_c0);
    bVar4 = isDebuggerActive();
    if ((bVar4) && (*(char *)(g_cs + 0x79) == '\0')) {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    bVar4 = checkIfShouldThrow(at);
    if (bVar4) {
      throwException();
    }
  }
  else {
    String::allocate((String *)&local_d8.data,0);
    ResultBuilder::ResultBuilder(&local_c0,at,file,line,expr,"",(String *)&local_d8.data);
    __x = extraout_XMM0_Qa;
    if ((local_d8.buf[0x17] < '\0') && (local_d8.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.data.ptr);
      __x = extraout_XMM0_Qa_00;
    }
    if ((bVar1 == false) || (*(char *)(g_cs + 0x6c) == '\x01')) {
      String::operator=(&local_c0.super_AssertData.m_decomp,&result->m_decomp);
      __x = extraout_XMM0_Qa_01;
    }
    ResultBuilder::log(&local_c0,__x);
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    if ((local_c0.super_AssertData.m_failed == true) && (bVar4 = checkIfShouldThrow(at), bVar4)) {
      throwException();
    }
  }
  if ((local_c0.super_AssertData.m_exception_string.content.string.field_0.buf[0x17] < '\0') &&
     (local_c0.super_AssertData.m_exception_string.content.string.field_0.data.ptr != (char *)0x0))
  {
    operator_delete__(local_c0.super_AssertData.m_exception_string.content.string.field_0.data.ptr);
  }
  if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_c0.super_AssertData.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_c0.super_AssertData.m_decomp.field_0.data.ptr);
  }
  if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     (local_c0.super_AssertData.m_exception.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_c0.super_AssertData.m_exception.field_0.data.ptr);
  }
  return bVar1;
}

Assistant:

bool decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       const Result& result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        return !failed;
    }